

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::InputScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_step,
                       void *p_step_fast,char *format,ImGuiInputTextFlags flags)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  char *text_end;
  void *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 local_80;
  char buf [64];
  
  pIVar2 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  if (pIVar2->CurrentWindow->SkipItems == false) {
    if (format == (char *)0x0) {
      format = GDataTypeInfo[data_type].PrintFmt;
    }
    DataTypeFormatString(buf,0x40,data_type,p_data,format);
    if ((flags & 0x20003U) == 0 && pIVar2->ActiveId == 0) {
      uVar5 = InputScalar_DefaultCharsFilter(data_type,format);
      flags = flags | uVar5;
    }
    if (p_step == (void *)0x0) {
      bVar3 = InputText(label,buf,0x40,flags | 0x8000010U,(ImGuiInputTextCallback)0x0,(void *)0x0);
      if (!bVar3) {
        return false;
      }
      bVar3 = DataTypeApplyFromText(buf,data_type,p_data,format);
      if (!bVar3) goto LAB_001f0c9b;
    }
    else {
      fVar7 = GetFrameHeight();
      BeginGroup();
      PushID(label);
      fVar8 = CalcItemWidth();
      fVar9 = (pIVar2->Style).ItemInnerSpacing.x + fVar7;
      fVar8 = fVar8 - (fVar9 + fVar9);
      fVar9 = 1.0;
      if (1.0 <= fVar8) {
        fVar9 = fVar8;
      }
      SetNextItemWidth(fVar9);
      bVar4 = false;
      bVar3 = InputText("",buf,0x40,flags | 0x8000010U,(ImGuiInputTextCallback)0x0,(void *)0x0);
      if (bVar3) {
        bVar4 = DataTypeApplyFromText(buf,data_type,p_data,format);
      }
      IVar1 = (pIVar2->Style).FramePadding;
      (pIVar2->Style).FramePadding.x = IVar1.y;
      if (((uint)flags >> 0xe & 1) != 0) {
        BeginDisabled(true);
      }
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
      local_80.x = fVar7;
      local_80.y = fVar7;
      bVar3 = ButtonEx("-",&local_80,0x2400);
      if (bVar3) {
        pvVar6 = p_step;
        if ((pIVar2->IO).KeyCtrl != false) {
          pvVar6 = p_step_fast;
        }
        if (p_step_fast == (void *)0x0) {
          pvVar6 = p_step;
        }
        DataTypeApplyOp(data_type,0x2d,p_data,p_data,pvVar6);
        bVar4 = true;
      }
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
      local_80.x = fVar7;
      local_80.y = fVar7;
      bVar3 = ButtonEx("+",&local_80,0x2400);
      if (bVar3) {
        pvVar6 = p_step;
        if ((pIVar2->IO).KeyCtrl != false) {
          pvVar6 = p_step_fast;
        }
        if (p_step_fast == (void *)0x0) {
          pvVar6 = p_step;
        }
        DataTypeApplyOp(data_type,0x2b,p_data,p_data,pvVar6);
        bVar4 = true;
      }
      if (((uint)flags >> 0xe & 1) != 0) {
        EndDisabled();
      }
      text_end = FindRenderedTextEnd(label,(char *)0x0);
      if (text_end != label) {
        SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
        TextEx(label,text_end,0);
      }
      (pIVar2->Style).FramePadding = IVar1;
      PopID();
      EndGroup();
      if (bVar4 == false) goto LAB_001f0c9b;
    }
    MarkItemEdited((pIVar2->LastItemData).ID);
    bVar3 = true;
  }
  else {
LAB_001f0c9b:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::InputScalar(const char* label, ImGuiDataType data_type, void* p_data, const void* p_step, const void* p_step_fast, const char* format, ImGuiInputTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;

    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;

    char buf[64];
    DataTypeFormatString(buf, IM_ARRAYSIZE(buf), data_type, p_data, format);

    // Testing ActiveId as a minor optimization as filtering is not needed until active
    if (g.ActiveId == 0 && (flags & (ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsScientific)) == 0)
        flags |= InputScalar_DefaultCharsFilter(data_type, format);
    flags |= ImGuiInputTextFlags_AutoSelectAll | ImGuiInputTextFlags_NoMarkEdited; // We call MarkItemEdited() ourselves by comparing the actual data rather than the string.

    bool value_changed = false;
    if (p_step != NULL)
    {
        const float button_size = GetFrameHeight();

        BeginGroup(); // The only purpose of the group here is to allow the caller to query item data e.g. IsItemActive()
        PushID(label);
        SetNextItemWidth(ImMax(1.0f, CalcItemWidth() - (button_size + style.ItemInnerSpacing.x) * 2));
        if (InputText("", buf, IM_ARRAYSIZE(buf), flags)) // PushId(label) + "" gives us the expected ID from outside point of view
            value_changed = DataTypeApplyFromText(buf, data_type, p_data, format);
        IMGUI_TEST_ENGINE_ITEM_INFO(g.LastItemData.ID, label, g.LastItemData.StatusFlags);

        // Step buttons
        const ImVec2 backup_frame_padding = style.FramePadding;
        style.FramePadding.x = style.FramePadding.y;
        ImGuiButtonFlags button_flags = ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups;
        if (flags & ImGuiInputTextFlags_ReadOnly)
            BeginDisabled();
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("-", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '-', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("+", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '+', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }
        if (flags & ImGuiInputTextFlags_ReadOnly)
            EndDisabled();

        const char* label_end = FindRenderedTextEnd(label);
        if (label != label_end)
        {
            SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_end);
        }
        style.FramePadding = backup_frame_padding;

        PopID();
        EndGroup();
    }
    else
    {
        if (InputText(label, buf, IM_ARRAYSIZE(buf), flags))
            value_changed = DataTypeApplyFromText(buf, data_type, p_data, format);
    }
    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    return value_changed;
}